

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall SM_Manager::CreateIndex(SM_Manager *this,char *relName,char *attrName)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  RC RVar3;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  size_t sVar4;
  bool bVar5;
  IX_IndexHandle ih;
  AttrCatEntry *aEntry;
  RelCatEntry *rEntry;
  char *pData;
  RID rid;
  RM_Record attrRec;
  RM_Record rec;
  RM_Record relRec;
  RM_FileHandle fh;
  RM_FileScan fs;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CreateIndex\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName =",0xc);
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar4 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   attrName=",0xc);
  if (attrName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar4 = strlen(attrName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,attrName,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  RM_Record::RM_Record(&relRec);
  uVar2 = GetRelEntry(this,relName,&relRec,&rEntry);
  if (uVar2 == 0) {
    RM_Record::RM_Record(&attrRec);
    uVar2 = FindAttr(this,relName,attrName,&attrRec,&aEntry);
    if (((uVar2 == 0) && (uVar2 = 0x132, aEntry->indexNo == -1)) &&
       (IX_Manager::DestroyIndex(this->ixm), uVar2 = extraout_EAX, extraout_EAX == 0)) {
      IX_Manager::DestroyIndex((IX_Manager *)&ih);
      RM_FileHandle::RM_FileHandle(&fh);
      RM_FileScan::RM_FileScan(&fs);
      IX_Manager::DestroyIndex(this->ixm);
      uVar2 = extraout_EAX_00;
      if (((extraout_EAX_00 == 0) &&
          (uVar2 = RM_Manager::OpenFile(this->rmm,relName,&fh), uVar2 == 0)) &&
         (uVar2 = RM_FileScan::OpenScan(&fs,&fh,INT,4,0,NO_OP,(void *)0x0,NO_HINT), uVar2 == 0)) {
        RM_Record::RM_Record(&rec);
        do {
          RVar3 = RM_FileScan::GetNextRec(&fs,&rec);
          if (RVar3 == 0x6e) {
            uVar2 = RM_FileScan::CloseScan(&fs);
            if (((uVar2 == 0) && (uVar2 = RM_Manager::CloseFile(this->rmm,&fh), uVar2 == 0)) &&
               (IX_Manager::DestroyIndex(this->ixm), uVar2 = extraout_EAX_02, extraout_EAX_02 == 0))
            {
              iVar1 = rEntry->indexCurrNum;
              aEntry->indexNo = iVar1;
              rEntry->indexCurrNum = iVar1 + 1;
              rEntry->indexCount = rEntry->indexCount + 1;
              uVar2 = RM_FileHandle::UpdateRec(&this->relcatFH,&relRec);
              if (uVar2 == 0) {
                uVar2 = RM_FileHandle::UpdateRec(&this->attrcatFH,&attrRec);
                if (uVar2 == 0) {
                  RVar3 = RM_FileHandle::ForcePages(&this->relcatFH,-1);
                  uVar2 = 1;
                  if (RVar3 == 0) {
                    RVar3 = RM_FileHandle::ForcePages(&this->attrcatFH,-1);
                    uVar2 = (uint)(RVar3 != 0);
                  }
                }
              }
            }
            break;
          }
          RID::RID(&rid);
          RVar3 = RM_Record::GetData(&rec,&pData);
          if (RVar3 == 0) {
            RVar3 = RM_Record::GetRid(&rec,&rid);
            if (RVar3 == 0) {
              IX_IndexHandle::DeleteEntry(&ih);
              bVar5 = extraout_EAX_01 == 0;
              if (!bVar5) {
                uVar2 = extraout_EAX_01;
              }
            }
            else {
              bVar5 = false;
              uVar2 = (uint)(RVar3 != 0);
            }
          }
          else {
            uVar2 = 1;
            bVar5 = false;
          }
          RID::~RID(&rid);
        } while (bVar5);
        RM_Record::~RM_Record(&rec);
      }
      RM_FileScan::~RM_FileScan(&fs);
      RM_FileHandle::~RM_FileHandle(&fh);
      IX_IndexHandle::~IX_IndexHandle(&ih);
    }
    RM_Record::~RM_Record(&attrRec);
  }
  RM_Record::~RM_Record(&relRec);
  return uVar2;
}

Assistant:

RC SM_Manager::CreateIndex(const char *relName,
                           const char *attrName)
{
  cout << "CreateIndex\n"
    << "   relName =" << relName << "\n"
    << "   attrName=" << attrName << "\n";

  RC rc = 0;
  RM_Record relRec;
  RelCatEntry *rEntry;
  if((rc = GetRelEntry(relName, relRec, rEntry))) // get the relation info
    return (rc);

  // Find the attribute associated with this index
  RM_Record attrRec; 
  AttrCatEntry *aEntry;
  if((rc = FindAttr(relName, attrName, attrRec, aEntry))){
    return (rc);
  }

  // check there isnt already an index
  if(aEntry->indexNo != NO_INDEXES)
    return (SM_INDEXEDALREADY);

  // Create this index
  if((rc = ixm.CreateIndex(relName, rEntry->indexCurrNum, aEntry->attrType, aEntry->attrLength)))
    return (rc);

  // Gets ready to scan through the file associated with the relation
  IX_IndexHandle ih;
  RM_FileHandle fh;
  RM_FileScan fs;
  if((rc = ixm.OpenIndex(relName, rEntry->indexCurrNum, ih)))
    return (rc);
  if((rc = rmm.OpenFile(relName, fh)))
    return (rc);

  // scan through the entire file:
  if((rc = fs.OpenScan(fh, INT, 4, 0, NO_OP, NULL))){
    return (rc);
  }
  RM_Record rec;
  while(fs.GetNextRec(rec) != RM_EOF){
    char *pData;
    RID rid;
    if((rc = rec.GetData(pData) || (rc = rec.GetRid(rid)))) // retrieve the record
      return (rc);
    if((rc = ih.InsertEntry(pData+ aEntry->offset, rid))) // insert into index
      return (rc);
  }
  if((rc = fs.CloseScan()) || (rc = rmm.CloseFile(fh)) || (rc = ixm.CloseIndex(ih)))
    return (rc);
  // Close all scans, indices and files
  
  // rewrite entry for attribute and relation in attrcat and relcat
  aEntry->indexNo = rEntry->indexCurrNum;
  rEntry->indexCurrNum++;
  rEntry->indexCount++;

  // write both back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = attrcatFH.UpdateRec(attrRec)))
    return (rc);
  if((rc = relcatFH.ForcePages() || (rc = attrcatFH.ForcePages())))
    return (rc);

  return (0);
}